

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O1

void __thiscall Assimp::HMPImporter::InternReadFile_HMP5(HMPImporter *this)

{
  int iVar1;
  uchar *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  aiMesh **ppaVar6;
  aiMesh *paVar7;
  ulong uVar8;
  aiVector3D *paVar9;
  aiNode *paVar10;
  uint *puVar11;
  ushort *puVar12;
  ushort *szPos;
  uint height;
  uint uVar13;
  uint width;
  aiVector3D *vOut;
  ulong uVar14;
  uchar *szCurrent;
  ushort *local_38;
  
  puVar2 = (this->super_MDLImporter).mBuffer;
  local_38 = (ushort *)(puVar2 + 0x54);
  ValidateHeader_HMP457(this);
  ((this->super_MDLImporter).pScene)->mNumMeshes = 1;
  ppaVar6 = (aiMesh **)operator_new__(8);
  ((this->super_MDLImporter).pScene)->mMeshes = ppaVar6;
  paVar7 = (aiMesh *)operator_new(0x520);
  paVar7->mPrimitiveTypes = 0;
  paVar7->mNumVertices = 0;
  paVar7->mNumFaces = 0;
  memset(&paVar7->mVertices,0,0xcc);
  paVar7->mBones = (aiBone **)0x0;
  paVar7->mMaterialIndex = 0;
  (paVar7->mName).length = 0;
  (paVar7->mName).data[0] = '\0';
  memset((paVar7->mName).data + 1,0x1b,0x3ff);
  paVar7->mNumAnimMeshes = 0;
  paVar7->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar7->mMethod = 0;
  (paVar7->mAABB).mMin.x = 0.0;
  (paVar7->mAABB).mMin.y = 0.0;
  (paVar7->mAABB).mMin.z = 0.0;
  (paVar7->mAABB).mMax.x = 0.0;
  (paVar7->mAABB).mMax.y = 0.0;
  (paVar7->mAABB).mMax.z = 0.0;
  paVar7->mTextureCoords[0] = (aiVector3D *)0x0;
  paVar7->mTextureCoords[1] = (aiVector3D *)0x0;
  paVar7->mTextureCoords[2] = (aiVector3D *)0x0;
  paVar7->mTextureCoords[3] = (aiVector3D *)0x0;
  paVar7->mTextureCoords[4] = (aiVector3D *)0x0;
  paVar7->mTextureCoords[5] = (aiVector3D *)0x0;
  paVar7->mTextureCoords[6] = (aiVector3D *)0x0;
  paVar7->mTextureCoords[7] = (aiVector3D *)0x0;
  paVar7->mNumUVComponents[0] = 0;
  paVar7->mNumUVComponents[1] = 0;
  paVar7->mNumUVComponents[2] = 0;
  paVar7->mNumUVComponents[3] = 0;
  paVar7->mNumUVComponents[4] = 0;
  paVar7->mNumUVComponents[5] = 0;
  paVar7->mNumUVComponents[6] = 0;
  paVar7->mNumUVComponents[7] = 0;
  paVar7->mColors[0] = (aiColor4D *)0x0;
  paVar7->mColors[1] = (aiColor4D *)0x0;
  paVar7->mColors[2] = (aiColor4D *)0x0;
  paVar7->mColors[3] = (aiColor4D *)0x0;
  paVar7->mColors[4] = (aiColor4D *)0x0;
  paVar7->mColors[5] = (aiColor4D *)0x0;
  paVar7->mColors[6] = (aiColor4D *)0x0;
  paVar7->mColors[7] = (aiColor4D *)0x0;
  *((this->super_MDLImporter).pScene)->mMeshes = paVar7;
  paVar7->mMaterialIndex = 0;
  iVar1 = *(int *)(puVar2 + 0x3c);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)iVar1;
  uVar8 = SUB168(auVar3 * ZEXT816(0xc),0);
  if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  paVar9 = (aiVector3D *)operator_new__(uVar8);
  if (iVar1 != 0) {
    memset(paVar9,0,(((long)iVar1 * 0xc - 0xcU) / 0xc) * 0xc + 0xc);
  }
  paVar7->mVertices = paVar9;
  iVar1 = *(int *)(puVar2 + 0x3c);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)iVar1;
  uVar8 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0xc),8) == 0) {
    uVar8 = SUB168(auVar4 * ZEXT816(0xc),0);
  }
  paVar9 = (aiVector3D *)operator_new__(uVar8);
  if (iVar1 != 0) {
    memset(paVar9,0,(((long)iVar1 * 0xc - 0xcU) / 0xc) * 0xc + 0xc);
  }
  paVar7->mNormals = paVar9;
  uVar14 = (ulong)((float)*(int *)(puVar2 + 0x3c) / *(float *)(puVar2 + 0x2c));
  uVar8 = (ulong)*(float *)(puVar2 + 0x2c);
  CreateMaterial(this,puVar2 + 0x54,(uchar **)&local_38);
  puVar12 = local_38 + 0x12;
  width = (uint)uVar8;
  szPos = local_38 + (uVar8 & 0xffffffff) * (uVar14 & 0xffffffff) * 2 + 0x12;
  local_38 = puVar12;
  MDLImporter::SizeCheck(&this->super_MDLImporter,szPos);
  height = (uint)uVar14;
  if (height != 0) {
    paVar9 = paVar7->mVertices;
    vOut = paVar7->mNormals;
    uVar5 = 0;
    do {
      if (width != 0) {
        uVar13 = 0;
        do {
          paVar9->x = (float)uVar13 * *(float *)(puVar2 + 0x24);
          paVar9->y = *(float *)(puVar2 + 0x28) * (float)uVar5;
          paVar9->z = ((float)*puVar12 / 65535.0 + -0.5) * *(float *)(puVar2 + 0x24) * 8.0;
          MD2::LookupNormalIndex((uint8_t)puVar12[1],vOut);
          paVar9 = paVar9 + 1;
          vOut = vOut + 1;
          puVar12 = puVar12 + 2;
          uVar13 = uVar13 + 1;
        } while (width != uVar13);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != height);
  }
  if (*(int *)(puVar2 + 0x30) != 0) {
    GenerateTextureCoords(this,width,height);
  }
  CreateOutputFaceList(this,width,height);
  paVar10 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar10);
  ((this->super_MDLImporter).pScene)->mRootNode = paVar10;
  paVar10 = ((this->super_MDLImporter).pScene)->mRootNode;
  (paVar10->mName).length = 0xc;
  builtin_strncpy((paVar10->mName).data,"terrain_root",0xd);
  ((this->super_MDLImporter).pScene)->mRootNode->mNumMeshes = 1;
  puVar11 = (uint *)operator_new__(4);
  ((this->super_MDLImporter).pScene)->mRootNode->mMeshes = puVar11;
  *((this->super_MDLImporter).pScene)->mRootNode->mMeshes = 0;
  return;
}

Assistant:

void HMPImporter::InternReadFile_HMP5( )
{
    // read the file header and skip everything to byte 84
    const HMP::Header_HMP5* pcHeader = (const HMP::Header_HMP5*)mBuffer;
    const unsigned char* szCurrent = (const unsigned char*)(mBuffer+84);
    ValidateHeader_HMP457();

    // generate an output mesh
    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[1];
    aiMesh* pcMesh = pScene->mMeshes[0] = new aiMesh();

    pcMesh->mMaterialIndex = 0;
    pcMesh->mVertices = new aiVector3D[pcHeader->numverts];
    pcMesh->mNormals = new aiVector3D[pcHeader->numverts];

    const unsigned int height = (unsigned int)(pcHeader->numverts / pcHeader->fnumverts_x);
    const unsigned int width =  (unsigned int)pcHeader->fnumverts_x;

    // generate/load a material for the terrain
    CreateMaterial(szCurrent,&szCurrent);

    // goto offset 120, I don't know why ...
    // (fixme) is this the frame header? I assume yes since it starts with 2.
    szCurrent += 36;
    SizeCheck(szCurrent + sizeof(const HMP::Vertex_HMP7)*height*width);

    // now load all vertices from the file
    aiVector3D* pcVertOut = pcMesh->mVertices;
    aiVector3D* pcNorOut = pcMesh->mNormals;
    const HMP::Vertex_HMP5* src = (const HMP::Vertex_HMP5*) szCurrent;
    for (unsigned int y = 0; y < height;++y)
    {
        for (unsigned int x = 0; x < width;++x)
        {
            pcVertOut->x = x * pcHeader->ftrisize_x;
            pcVertOut->y = y * pcHeader->ftrisize_y;
            pcVertOut->z = (((float)src->z / 0xffff)-0.5f) * pcHeader->ftrisize_x * 8.0f;
            MD2::LookupNormalIndex(src->normals162index, *pcNorOut );
            ++pcVertOut;++pcNorOut;++src;
        }
    }

    // generate texture coordinates if necessary
    if (pcHeader->numskins)
        GenerateTextureCoords(width,height);

    // now build a list of faces
    CreateOutputFaceList(width,height);

    // there is no nodegraph in HMP files. Simply assign the one mesh
    // (no, not the one ring) to the root node
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("terrain_root");
    pScene->mRootNode->mNumMeshes = 1;
    pScene->mRootNode->mMeshes = new unsigned int[1];
    pScene->mRootNode->mMeshes[0] = 0;
}